

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GenerateAppleInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,char *fname)

{
  pointer pcVar1;
  cmMakefile *this_00;
  long *infile;
  bool bVar2;
  char *pcVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  string inFile;
  string inMod;
  cmNewLineStyle local_1ec;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  long *local_50;
  long local_40 [2];
  
  pcVar1 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"MACOSX_BUNDLE_INFO_PLIST","")
  ;
  pcVar3 = cmGeneratorTarget::GetProperty(target,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (pcVar3 == (char *)0x0) {
    pcVar6 = "MacOSXBundleInfo.plist.in";
  }
  else {
    pcVar6 = "MacOSXBundleInfo.plist.in";
    if (*pcVar3 != '\0') {
      pcVar6 = pcVar3;
    }
  }
  std::__cxx11::string::string((string *)&local_1e8,pcVar6,(allocator *)local_1c8);
  bVar2 = cmsys::SystemTools::FileIsFullPath((char *)local_1e8);
  if (!bVar2) {
    cmMakefile::GetModulesFile_abi_cxx11_((string *)local_1c8,this->Makefile,(char *)local_1e8);
    if (local_1c8._8_8_ != 0) {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
    }
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
  bVar2 = cmsys::SystemTools::FileExists((char *)local_1e8,true);
  if (bVar2) {
    this_00 = this->Makefile;
    cmMakefile::PushScope(this_00);
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_EXECUTABLE_NAME","");
    cmMakefile::AddDefinition(this_00,(string *)local_1c8,(targetName->_M_dataplus)._M_p);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_INFO_STRING","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_ICON_FILE","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_GUI_IDENTIFIER","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_LONG_VERSION_STRING","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_BUNDLE_NAME","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_SHORT_VERSION_STRING","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_BUNDLE_VERSION","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"MACOSX_BUNDLE_COPYRIGHT","");
    cmLGInfoProp(this_00,target,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    infile = local_1e8;
    cmNewLineStyle::cmNewLineStyle(&local_1ec);
    cmMakefile::ConfigureFile(this_00,(char *)infile,fname,false,false,false,local_1ec);
    cmMakefile::PopScope(this_00);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Target ",7);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Info.plist template \"",0x16);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" could not be found.",0x15);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_50,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateAppleInfoPList(cmGeneratorTarget* target,
                                              const std::string& targetName,
                                              const char* fname)
{
  // Find the Info.plist template.
  const char* in = target->GetProperty("MACOSX_BUNDLE_INFO_PLIST");
  std::string inFile = (in && *in) ? in : "MacOSXBundleInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile.c_str())) {
    std::string inMod = this->Makefile->GetModulesFile(inFile.c_str());
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile.c_str(), true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str().c_str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_BUNDLE_EXECUTABLE_NAME", targetName.c_str());
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_INFO_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_GUI_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_LONG_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_NAME");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_VERSION");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_COPYRIGHT");
  mf->ConfigureFile(inFile.c_str(), fname, false, false, false);
}